

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O2

void __thiscall FNodeBuilder::GroupSegPlanesSimple(FNodeBuilder *this)

{
  FSimpleVert FVar1;
  uint uVar2;
  int iVar3;
  FPrivSeg *pFVar4;
  FSimpleLine *pFVar5;
  FPrivVert *pFVar6;
  FSimpleVert FVar7;
  long lVar8;
  ulong uVar9;
  FPrivSeg **ppFVar10;
  DWORD DVar11;
  
  TArray<FNodeBuilder::FSimpleLine,_FNodeBuilder::FSimpleLine>::Resize
            (&this->Planes,(this->Segs).Count);
  uVar2 = (this->Segs).Count;
  pFVar4 = (this->Segs).Array;
  pFVar5 = (this->Planes).Array;
  lVar8 = 0;
  uVar9 = 0;
  if (0 < (int)uVar2) {
    uVar9 = (ulong)uVar2;
  }
  pFVar6 = (this->Vertices).Array;
  ppFVar10 = &pFVar4->hashnext;
  DVar11 = 0;
  for (; uVar9 * 0x10 != lVar8; lVar8 = lVar8 + 0x10) {
    *(DWORD *)(ppFVar10 + -4) = DVar11 + 1;
    *ppFVar10 = (FPrivSeg *)0x0;
    *(DWORD *)(ppFVar10 + -1) = DVar11;
    *(bool *)((long)ppFVar10 + -4) = true;
    iVar3 = *(int *)((long)ppFVar10 + -0x3c);
    FVar7 = pFVar6[((FPrivSeg *)(ppFVar10 + -8))->v1].super_FSimpleVert;
    *(FSimpleVert *)((long)&pFVar5->x + lVar8) = FVar7;
    FVar1 = pFVar6[iVar3].super_FSimpleVert;
    *(ulong *)((long)&pFVar5->dx + lVar8) = CONCAT44(FVar1.y - FVar7.y,FVar1.x - FVar7.x);
    ppFVar10 = ppFVar10 + 9;
    DVar11 = DVar11 + 1;
  }
  pFVar4[uVar2 - 1].next = 0xffffffff;
  TArray<unsigned_char,_unsigned_char>::Reserve(&this->PlaneChecked,uVar2 + 7 >> 3);
  return;
}

Assistant:

void FNodeBuilder::GroupSegPlanesSimple()
{
	Planes.Resize(Segs.Size());
	for (int i = 0; i < (int)Segs.Size(); ++i)
	{
		FPrivSeg *seg = &Segs[i];
		FSimpleLine *pline = &Planes[i];
		seg->next = i+1;
		seg->hashnext = NULL;
		seg->planenum = i;
		seg->planefront = true;
		pline->x = Vertices[seg->v1].x;
		pline->y = Vertices[seg->v1].y;
		pline->dx = Vertices[seg->v2].x - Vertices[seg->v1].x;
		pline->dy = Vertices[seg->v2].y - Vertices[seg->v1].y;
	}
	Segs.Last().next = DWORD_MAX;
	PlaneChecked.Reserve((Segs.Size() + 7) / 8);
}